

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

Scene * red_blue(void)

{
  Point3 look_from;
  Point3 look_at;
  Vec3 vup;
  Scene *in_RDI;
  double r;
  ObjectList objects;
  Camera camera;
  undefined1 local_199;
  Sphere *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  shared_ptr<Lambertian> local_188;
  double local_178 [4];
  value_type local_158;
  value_type local_148;
  undefined **local_138;
  vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> local_130;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  Camera local_e0;
  
  local_138 = &PTR_hit_00110af0;
  local_130.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178[0] = 0.7071067811865476;
  local_e0.origin_.e[0] = -0.7071067811865476;
  local_e0.origin_.e[1] = 0.0;
  local_e0.origin_.e[2] = -1.0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110b60;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110c10;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0x3ff00000;
  local_198 = (Sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Sphere,std::allocator<Sphere>,Vec3,double&,std::shared_ptr<Lambertian>>
            (&_Stack_190,&local_198,(allocator<Sphere> *)&local_199,&local_e0.origin_,local_178,
             &local_188);
  local_148.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_198->super_Object
  ;
  local_148.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_190._M_pi;
  local_198 = (Sphere *)0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_130,&local_148);
  if (local_148.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
  }
  if (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_e0.origin_.e[0] = local_178[0];
  local_e0.origin_.e[1] = 0.0;
  local_e0.origin_.e[2] = -1.0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00110b60;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_00110c10;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3ff00000;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0;
  local_198 = (Sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Sphere,std::allocator<Sphere>,Vec3,double&,std::shared_ptr<Lambertian>>
            (&_Stack_190,&local_198,(allocator<Sphere> *)&local_199,&local_e0.origin_,local_178,
             &local_188);
  local_158.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_198->super_Object
  ;
  local_158.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_190._M_pi;
  local_198 = (Sphere *)0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_130,&local_158);
  if (local_158.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
  }
  if (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0xbff0000000000000;
  local_178[1] = 0.0;
  local_178[2] = 1.0;
  local_178[3] = 0.0;
  look_from.e[2] = 0.0;
  look_from.e[0] = 0.0;
  look_from.e[1] = 0.0;
  look_at.e[2] = -1.0;
  look_at.e[0] = 0.0;
  look_at.e[1] = 0.0;
  vup.e[2] = 0.0;
  vup.e[0] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,0);
  vup.e[1] = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,8);
  Camera::Camera(&local_e0,look_from,look_at,vup,90.0,1.7777777777777777,0.0,1.0);
  (in_RDI->objects_).super_Object._vptr_Object = (_func_int **)&PTR_hit_00110af0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::vector
            (&(in_RDI->objects_).objects_,&local_130);
  memcpy(&in_RDI->camera_,&local_e0,0xb0);
  local_138 = &PTR_hit_00110af0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::~vector
            (&local_130);
  return in_RDI;
}

Assistant:

Scene red_blue() {
  ObjectList objects;

  double r = cos(PI/4);
  objects.add(std::make_shared<Sphere>(Point3(-r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(0,0,1))));
  objects.add(std::make_shared<Sphere>(Point3(r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(1, 0, 0))));

  // Setup camera
  Point3 camera_position{0, 0, 0};
  Point3 camera_target{0, 0, -1};
  double field_of_view = 90;
  double aperture = 0.0; // no defocus blur

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                (camera_position - camera_target).length());

  return {objects, camera};
}